

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<double,_signed_char>::Run
          (DataTransform<double,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  NumericType NVar2;
  WarningType WVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  ostream *poVar7;
  size_t *__idx;
  ulong uVar8;
  char data_to_write;
  int iVar9;
  bool bVar10;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar11;
  allocator local_269;
  double input_data;
  string *local_260;
  double local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_260 = &this->print_format_;
  iVar9 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar10 = word._M_string_length == 0;
      if (!bVar10) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (double)in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar10) goto LAB_00131cc3;
      if (bVar10) {
        if (bVar10) {
LAB_00131ef7:
          bVar10 = true;
          if ((this->is_ascii_output_ == true) && (iVar9 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00131f19:
          bVar10 = false;
        }
        return bVar10;
      }
    }
    else {
      bVar10 = sptk::ReadStream<double>(&input_data,input_stream);
      if (!bVar10) goto LAB_00131ef7;
LAB_00131cc3:
      cVar4 = (char)(int)input_data;
      data_to_write = this->minimum_value_;
      cVar1 = this->maximum_value_;
      if (data_to_write < cVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_258 = input_data;
          in_ST6 = in_ST5;
          if (((double)(short)data_to_write <= input_data) &&
             (data_to_write = cVar1, input_data <= (double)(short)cVar1)) goto LAB_00131da4;
        }
        else {
          uVar8 = (ulong)cVar1;
          if (NVar2 == kUnsignedInteger) {
            uVar6 = (long)(input_data - 9.223372036854776e+18) & (long)input_data >> 0x3f |
                    (long)input_data;
            if ((ulong)(long)data_to_write <= uVar6) {
              bVar10 = uVar8 < uVar6;
              data_to_write = cVar4;
              if (bVar10) {
                data_to_write = cVar1;
              }
              goto LAB_00131da9;
            }
          }
          else {
            if (NVar2 != kSignedInteger) goto LAB_00131da4;
            lVar5 = (long)input_data;
            if (data_to_write <= lVar5) {
              bVar10 = (long)uVar8 < lVar5;
              data_to_write = cVar4;
              if ((long)uVar8 < lVar5) {
                data_to_write = cVar1;
              }
              goto LAB_00131da9;
            }
          }
        }
LAB_00131dcd:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar9);
          std::operator<<(poVar7,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_269);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) goto LAB_00131f19;
        }
      }
      else {
LAB_00131da4:
        bVar10 = false;
        data_to_write = cVar4;
LAB_00131da9:
        if ((bVar10) || (this->rounding_ == false)) {
          if (bVar10) goto LAB_00131dcd;
        }
        else {
          if (input_data <= 0.0) {
            dVar11 = input_data + -0.5;
          }
          else {
            dVar11 = input_data + 0.5;
          }
          data_to_write = (char)(int)dVar11;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar10 = sptk::SnPrintf<signed_char>(data_to_write,local_260,0x80,buffer);
        if (!bVar10) goto LAB_00131f19;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar9 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar10 = sptk::WriteStream<signed_char>(data_to_write,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar10) goto LAB_00131f19;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }